

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_tran_ep_cancel(nni_aio *aio,void *arg,int rv)

{
  sfd_tran_ep *ep;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  nni_mtx_lock((nni_mtx *)arg);
  if (*(nni_aio **)((long)arg + 200) == aio) {
    *(undefined8 *)((long)arg + 200) = 0;
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
sfd_tran_ep_cancel(nni_aio *aio, void *arg, int rv)
{
	sfd_tran_ep *ep = arg;
	nni_mtx_lock(&ep->mtx);
	if (ep->useraio == aio) {
		ep->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
}